

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O3

bool __thiscall QHttpHeaders::contains(QHttpHeaders *this,QAnyStringView name)

{
  QHttpHeadersPrivate *pQVar1;
  long lVar2;
  const_iterator cVar3;
  const_iterator __last;
  long in_FS_OFFSET;
  bool bVar4;
  anon_class_1_0_00000001 local_41;
  variant<QHttpHeaders::WellKnownHeader,_QByteArray> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QHttpHeadersPrivate *)0x0) || (lVar2 = (pQVar1->headers).d.size, lVar2 == 0)) {
    bVar4 = false;
  }
  else {
    cVar3.i = (pQVar1->headers).d.ptr;
    __last.i = cVar3.i + lVar2;
    HeaderName::HeaderName((HeaderName *)&local_40,name);
    cVar3 = std::find_if<QList<Header>::const_iterator,headerNameMatches(HeaderName_const&)::__0>
                      (cVar3,__last,(HeaderName *)&local_40);
    bVar4 = cVar3.i != __last.i;
    if ((long)(char)local_40.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index
        != -1) {
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr
        [(char)local_40.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_index].
        _M_data)(&local_41,&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaders::contains(QAnyStringView name) const
{
    if (isEmpty())
        return false;

    return std::any_of(d->headers.cbegin(), d->headers.cend(), headerNameMatches(HeaderName{name}));
}